

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_draw_text(nk_command_buffer *b,nk_rect r,char *string,int length,nk_user_font *font,
                 nk_color bg,nk_color fg)

{
  float fVar1;
  float fVar2;
  void *pvVar3;
  nk_size length_00;
  float fVar4;
  float fVar5;
  float fVar8;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  float space;
  float fVar10;
  undefined1 auVar9 [16];
  float local_38;
  int local_34;
  
  auVar7._0_8_ = r._8_8_;
  if (b == (nk_command_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x194b,
                  "void nk_draw_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_user_font *, struct nk_color, struct nk_color)"
                 );
  }
  if (font == (nk_user_font *)0x0) {
    __assert_fail("font",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x194c,
                  "void nk_draw_text(struct nk_command_buffer *, struct nk_rect, const char *, int, const struct nk_user_font *, struct nk_color, struct nk_color)"
                 );
  }
  if (length == 0 || string == (char *)0x0) {
    return;
  }
  if ((uint)bg < 0x1000000 && (uint)fg < 0x1000000) {
    return;
  }
  fVar4 = r.x;
  fVar8 = r.y;
  space = r.w;
  fVar10 = r.h;
  if (b->use_clipping != 0) {
    fVar5 = (b->clip).w;
    if ((fVar5 == 0.0) && (!NAN(fVar5))) {
      return;
    }
    fVar1 = (b->clip).h;
    if ((fVar1 == 0.0) && (!NAN(fVar1))) {
      return;
    }
    fVar2 = (b->clip).x;
    if (fVar4 + space < fVar2) {
      return;
    }
    if (fVar5 + fVar2 < fVar4) {
      return;
    }
    fVar5 = (b->clip).y;
    if (fVar8 + fVar10 < fVar5) {
      return;
    }
    if (fVar1 + fVar5 < fVar8) {
      return;
    }
  }
  fVar5 = (*font->width)(font->userdata,font->height,string,length);
  if ((fVar5 <= space) ||
     (length = nk_text_clamp(font,string,length,space,&local_34,&local_38,(nk_rune *)0x0,0),
     length != 0)) {
    length_00 = (nk_size)length;
    pvVar3 = nk_command_buffer_push(b,NK_COMMAND_TEXT,length_00 + 0x39);
    auVar7._12_4_ = r.h;
    if (pvVar3 != (void *)0x0) {
      auVar7._8_4_ = fVar10;
      auVar6._0_4_ = (int)fVar4;
      auVar6._4_4_ = (int)fVar8;
      auVar6._8_4_ = (int)space;
      auVar6._12_4_ = (int)fVar10;
      auVar9 = pshuflw(auVar7,auVar6,0xe8);
      auVar7 = pshufhw(auVar6,auVar6,0xe8);
      *(ulong *)((long)pvVar3 + 0x20) = CONCAT44(auVar7._8_4_,auVar9._0_4_);
      *(short *)((long)pvVar3 + 0x18) = bg._0_2_;
      *(nk_byte *)((long)pvVar3 + 0x1a) = bg.b;
      *(nk_byte *)((long)pvVar3 + 0x1b) = bg.a;
      *(short *)((long)pvVar3 + 0x1c) = fg._0_2_;
      *(nk_byte *)((long)pvVar3 + 0x1e) = fg.b;
      *(nk_byte *)((long)pvVar3 + 0x1f) = fg.a;
      *(nk_user_font **)((long)pvVar3 + 0x10) = font;
      *(int *)((long)pvVar3 + 0x2c) = length;
      *(float *)((long)pvVar3 + 0x28) = font->height;
      nk_memcopy((void *)((long)pvVar3 + 0x30),string,length_00);
      *(undefined1 *)((long)pvVar3 + length_00 + 0x30) = 0;
    }
  }
  return;
}

Assistant:

NK_API void
nk_draw_text(struct nk_command_buffer *b, struct nk_rect r,
    const char *string, int length, const struct nk_user_font *font,
    struct nk_color bg, struct nk_color fg)
{
    float text_width = 0;
    struct nk_command_text *cmd;

    NK_ASSERT(b);
    NK_ASSERT(font);
    if (!b || !string || !length || (bg.a == 0 && fg.a == 0)) return;
    if (b->use_clipping) {
        const struct nk_rect *c = &b->clip;
        if (c->w == 0 || c->h == 0 || !NK_INTERSECT(r.x, r.y, r.w, r.h, c->x, c->y, c->w, c->h))
            return;
    }

    /* make sure text fits inside bounds */
    text_width = font->width(font->userdata, font->height, string, length);
    if (text_width > r.w){
        int glyphs = 0;
        float txt_width = (float)text_width;
        length = nk_text_clamp(font, string, length, r.w, &glyphs, &txt_width, 0,0);
    }

    if (!length) return;
    cmd = (struct nk_command_text*)
        nk_command_buffer_push(b, NK_COMMAND_TEXT, sizeof(*cmd) + (nk_size)(length + 1));
    if (!cmd) return;
    cmd->x = (short)r.x;
    cmd->y = (short)r.y;
    cmd->w = (unsigned short)r.w;
    cmd->h = (unsigned short)r.h;
    cmd->background = bg;
    cmd->foreground = fg;
    cmd->font = font;
    cmd->length = length;
    cmd->height = font->height;
    NK_MEMCPY(cmd->string, string, (nk_size)length);
    cmd->string[length] = '\0';
}